

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

bool __thiscall libebml::EbmlElement::ForceSize(EbmlElement *this,uint64 NewSize)

{
  uint64 uVar1;
  int iVar2;
  int iVar3;
  uint64 OldSize;
  int OldSizeLen;
  uint64 NewSize_local;
  EbmlElement *this_local;
  
  if ((this->bSizeIsFinite & 1U) == 0) {
    iVar2 = CodedSizeLength(this->Size,this->SizeLength,(bool)(this->bSizeIsFinite & 1));
    uVar1 = this->Size;
    this->Size = NewSize;
    iVar3 = CodedSizeLength(this->Size,this->SizeLength,(bool)(this->bSizeIsFinite & 1));
    if (iVar3 == iVar2) {
      this->bSizeIsFinite = true;
      this_local._7_1_ = true;
    }
    else {
      this->Size = uVar1;
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EbmlElement::ForceSize(uint64 NewSize)
{
  if (bSizeIsFinite) {
    return false;
  }

  int OldSizeLen = CodedSizeLength(Size, SizeLength, bSizeIsFinite);
  uint64 OldSize = Size;

  Size = NewSize;

  if (CodedSizeLength(Size, SizeLength, bSizeIsFinite) == OldSizeLen) {
    bSizeIsFinite = true;
    return true;
  }
  Size = OldSize;

  return false;
}